

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O3

void __thiscall ON_LinearWorkflow::ON_LinearWorkflow(ON_LinearWorkflow *this,ON_LinearWorkflow *lw)

{
  CImpl *pCVar1;
  
  this->_vptr_ON_LinearWorkflow = (_func_int **)&PTR__ON_LinearWorkflow_00812920;
  pCVar1 = (CImpl *)operator_new(0x40);
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (pCVar1->super_ON_InternalXMLImpl)._local_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._model_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._vptr_ON_InternalXMLImpl =
       (_func_int **)&PTR__ON_InternalXMLImpl_008129f8;
  this->_impl = pCVar1;
  operator=(this,lw);
  return;
}

Assistant:

ON_LinearWorkflow::ON_LinearWorkflow(const ON_LinearWorkflow& lw)
{
  _impl = new CImpl;
  operator = (lw);
}